

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O3

void __thiscall QTcpServerPrivate::readNotification(QTcpServerPrivate *this)

{
  QObject *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char cVar5;
  int iVar6;
  SocketState SVar7;
  SocketError SVar8;
  long lVar9;
  int *piVar10;
  long in_FS_OFFSET;
  bool bVar11;
  SocketError local_5c;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  while( true ) {
    iVar6 = (**(code **)(*(long *)this + 0x28))(this);
    if (this->maxConnections <= iVar6) {
      cVar5 = (**(code **)(*(long *)this->socketEngine + 0x138))();
      if (cVar5 != '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,0);
          return;
        }
        goto LAB_001c69c6;
      }
      goto LAB_001c69a7;
    }
    lVar9 = (**(code **)(*(long *)this->socketEngine + 0xa0))();
    if (lVar9 == -1) break;
    if (pQVar1 == (QObject *)0x0) {
      piVar10 = (int *)0x0;
    }
    else {
      piVar10 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar1);
    }
    (**(code **)(*(long *)pQVar1 + 0x70))(pQVar1);
    if (piVar10 == (int *)0x0) goto LAB_001c69a7;
    if (piVar10[1] != 0) {
      QMetaObject::activate(pQVar1,&QTcpServer::staticMetaObject,0,(void **)0x0);
    }
    if ((piVar10[1] == 0) ||
       (*(QAbstractSocketEngine **)(*(long *)(pQVar1 + 8) + 0xb0) == (QAbstractSocketEngine *)0x0))
    {
      bVar11 = false;
    }
    else {
      SVar7 = QAbstractSocketEngine::state
                        (*(QAbstractSocketEngine **)(*(long *)(pQVar1 + 8) + 0xb0));
      bVar11 = SVar7 == ListeningState;
    }
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      operator_delete(piVar10);
    }
    if (!bVar11) {
LAB_001c69a7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
LAB_001c69c6:
      __stack_chk_fail();
    }
  }
  SVar8 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
  if (SVar8 != TemporaryError) {
    (**(code **)(**(long **)(*(long *)(pQVar1 + 8) + 0xb0) + 0x140))
              (*(long **)(*(long *)(pQVar1 + 8) + 0xb0),0);
    SVar8 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
    this->serverSocketError = SVar8;
    QAbstractSocketEngine::errorString(&local_58,(QAbstractSocketEngine *)this->socketEngine);
    pQVar2 = &((this->serverSocketErrorString).d.d)->super_QArrayData;
    pcVar3 = (this->serverSocketErrorString).d.ptr;
    (this->serverSocketErrorString).d.d = local_58.d.d;
    (this->serverSocketErrorString).d.ptr = local_58.d.ptr;
    qVar4 = (this->serverSocketErrorString).d.size;
    (this->serverSocketErrorString).d.size = local_58.d.size;
    local_58.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_58.d.d = (Data *)pQVar2;
        local_58.d.ptr = pcVar3;
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    local_5c = this->serverSocketError;
    local_58.d.ptr = (char16_t *)&local_5c;
    local_58.d.d = (Data *)0x0;
    QMetaObject::activate(pQVar1,&QTcpServer::staticMetaObject,2,(void **)&local_58);
  }
  goto LAB_001c69a7;
}

Assistant:

void QTcpServerPrivate::readNotification()
{
    Q_Q(QTcpServer);
    for (;;) {
        if (totalPendingConnections() >= maxConnections) {
#if defined (QTCPSERVER_DEBUG)
            qDebug("QTcpServerPrivate::_q_processIncomingConnection() too many connections");
#endif
            if (socketEngine->isReadNotificationEnabled())
                socketEngine->setReadNotificationEnabled(false);
            return;
        }

        qintptr descriptor = socketEngine->accept();
        if (descriptor == -1) {
            if (socketEngine->error() != QAbstractSocket::TemporaryError) {
                q->pauseAccepting();
                serverSocketError = socketEngine->error();
                serverSocketErrorString = socketEngine->errorString();
                emit q->acceptError(serverSocketError);
            }
            break;
        }
#if defined (QTCPSERVER_DEBUG)
        qDebug("QTcpServerPrivate::_q_processIncomingConnection() accepted socket %i", descriptor);
#endif
        QPointer<QTcpServer> that = q;
        q->incomingConnection(descriptor);

        if (that)
            emit q->newConnection();

        if (!that || !q->isListening())
            return;
    }
}